

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  bool bVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmLinkImplItem *this_00;
  cmGeneratorTarget *this_01;
  cmLocalGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  undefined7 extraout_var;
  cmValue __args;
  cmLinkImplementationLibraries *pcVar9;
  string *psVar10;
  string *psVar11;
  ostream *poVar12;
  string *psVar13;
  cmake *this_02;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar14;
  pointer this_03;
  pointer pEVar15;
  string_view value;
  __ireturn_type _Var16;
  allocator<char> local_379;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_378;
  undefined4 local_36c;
  string propertyName;
  string local_348;
  string *local_328;
  cmListFileBacktrace *local_320;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_318;
  EvaluatedTargetPropertyEntries entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string obj_dir;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_378 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
              __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"INCLUDE_DIRECTORIES",(allocator<char> *)&obj_dir);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_148,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_148);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_dir,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&propertyName);
  cmMakefile::GetDefExpandList(pcVar2,&obj_dir,&debugProperties,false);
  std::__cxx11::string::~string((string *)&obj_dir);
  if (this->DebugIncludesDone == false) {
    bVar5 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[20],_0>
                      (&debugProperties,(char (*) [20])0x617134);
    local_36c = (undefined4)CONCAT71(extraout_var,bVar5);
  }
  else {
    local_36c = 0;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  anon_unknown.dwarf_15f1f15::EvaluateTargetPropertyEntries
            (&entries,this,config,lang,&dagChecker,&this->IncludeDirectoriesEntries);
  bVar5 = std::operator==(lang,"Swift");
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_dir,"Swift_MODULE_DIRECTORY",(allocator<char> *)&propertyName);
    anon_unknown.dwarf_15f1f15::AddLangSpecificImplicitIncludeDirectories
              (this,lang,config,&obj_dir,BINARY,&entries);
    std::__cxx11::string::~string((string *)&obj_dir);
  }
  bVar5 = CanCompileSources(this);
  if (((bVar5) && (bVar5 = std::operator!=(lang,"Swift"), bVar5)) &&
     (bVar5 = std::operator!=(lang,"Fortran"), bVar5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&propertyName,"ISPC_HEADER_DIRECTORY",(allocator<char> *)&obj_dir);
    GetAllConfigCompileLanguages_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&obj_dir,this);
    bVar5 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&obj_dir,(char (*) [5])"ISPC");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&obj_dir);
    if (bVar5) {
      __args = GetProperty(this,&propertyName);
      if (__args.Value == (string *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x16])
                  (&obj_dir,this->GlobalGenerator,&this->ObjectDirectory,config);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>(local_378,&obj_dir);
        std::__cxx11::string::~string((string *)&obj_dir);
      }
      else {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>(local_378,__args.Value);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_dir,"ISPC",(allocator<char> *)&local_348);
    anon_unknown.dwarf_15f1f15::AddLangSpecificImplicitIncludeDirectories
              (this,&obj_dir,config,&propertyName,OBJECT,&entries);
    std::__cxx11::string::~string((string *)&obj_dir);
    std::__cxx11::string::~string((string *)&propertyName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_dir,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&propertyName);
  anon_unknown.dwarf_15f1f15::AddInterfaceEntries
            (this,config,&obj_dir,lang,&dagChecker,&entries,Yes,Usage);
  std::__cxx11::string::~string((string *)&obj_dir);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_dir,"APPLE",(allocator<char> *)&propertyName);
  bVar5 = cmMakefile::IsOn(pcVar2,&obj_dir);
  std::__cxx11::string::~string((string *)&obj_dir);
  pEVar15 = entries.Entries.
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar5) &&
     (pcVar9 = GetLinkImplementationLibraries(this,config,Usage),
     pEVar15 = entries.Entries.
               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pcVar9 != (cmLinkImplementationLibraries *)0x0)) {
    pcVar3 = (pcVar9->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_03 = (pcVar9->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pEVar15 = entries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start, this_03 != pcVar3;
        this_03 = this_03 + 1) {
      psVar10 = cmLinkItem::AsStr_abi_cxx11_(&this_03->super_cmLinkItem);
      psVar11 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&propertyName,psVar10,psVar11);
      if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
           frameworkCheck == '\0') &&
         (iVar7 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                       ::frameworkCheck), iVar7 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetIncludeDirectories::frameworkCheck,
                   "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &GetIncludeDirectories::frameworkCheck,&__dso_handle);
        __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::frameworkCheck);
      }
      bVar5 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,propertyName._M_dataplus._M_p);
      if (bVar5) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&obj_dir,&GetIncludeDirectories::frameworkCheck.regmatch,1);
        std::__cxx11::string::operator=((string *)&propertyName,(string *)&obj_dir);
        std::__cxx11::string::~string((string *)&obj_dir);
        local_318.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_318.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_318);
        obj_dir._M_string_length =
             (size_type)
             local_318.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        obj_dir.field_2._M_allocated_capacity =
             (size_type)
             local_318.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_318.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_318.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        obj_dir.field_2._8_8_ = 0;
        obj_dir._M_dataplus._M_p = (pointer)this_03;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_318.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (obj_dir.field_2._M_local_buf + 8),&propertyName);
        std::
        vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                  (&entries.Entries,(EvaluatedTargetPropertyEntry *)&obj_dir);
        anon_unknown.dwarf_15f1f15::EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                  ((EvaluatedTargetPropertyEntry *)&obj_dir);
      }
      std::__cxx11::string::~string((string *)&propertyName);
    }
  }
  do {
    if (pEVar15 ==
        entries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003d98ef:
      anon_unknown.dwarf_15f1f15::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
                (&entries);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugProperties);
      cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniqueIncludes._M_h);
      return (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_378;
    }
    this_00 = pEVar15->LinkImplItem;
    local_328 = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem);
    this_01 = (this_00->super_cmLinkItem).Target;
    if (this_01 == (cmGeneratorTarget *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = IsImported(this_01);
    }
    bVar1 = this_00->CheckCMP0027;
    propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
    propertyName._M_string_length = 0;
    propertyName.field_2._M_local_buf[0] = '\0';
    psVar11 = (pEVar15->Values).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_320 = &pEVar15->Backtrace;
    for (psVar10 = (pEVar15->Values).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar11;
        psVar10 = psVar10 + 1) {
      if ((bVar5 != false) && (bVar6 = cmsys::SystemTools::FileExists(psVar10), !bVar6)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
        MVar14 = FATAL_ERROR;
        if (bVar1 != false) {
          PVar8 = GetPolicyStatusCMP0027(this);
          if (PVar8 != OLD) {
            if (PVar8 != WARN) goto LAB_003d9859;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_348,(cmPolicies *)&DAT_0000001b,id_00);
            poVar12 = std::operator<<((ostream *)&obj_dir,(string *)&local_348);
            std::operator<<(poVar12,"\n");
            std::__cxx11::string::~string((string *)&local_348);
          }
          MVar14 = AUTHOR_WARNING;
        }
LAB_003d9859:
        poVar12 = std::operator<<((ostream *)&obj_dir,"Imported target \"");
        poVar12 = std::operator<<(poVar12,(string *)local_328);
        poVar12 = std::operator<<(poVar12,"\" includes non-existent path\n  \"");
        poVar12 = std::operator<<(poVar12,(string *)psVar10);
        std::operator<<(poVar12,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar4 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(pcVar4,MVar14,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
LAB_003d98d8:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
        std::__cxx11::string::~string((string *)&propertyName);
        goto LAB_003d98ef;
      }
      bVar6 = cmsys::SystemTools::FileIsFullPath(psVar10);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
        if (local_328->_M_string_length == 0) {
          PVar8 = GetPolicyStatusCMP0021(this);
          if (PVar8 == OLD) {
            bVar6 = true;
            MVar14 = FATAL_ERROR;
          }
          else if (PVar8 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_348,(cmPolicies *)0x15,id);
            poVar12 = std::operator<<((ostream *)&obj_dir,(string *)&local_348);
            std::operator<<(poVar12,"\n");
            std::__cxx11::string::~string((string *)&local_348);
            MVar14 = AUTHOR_WARNING;
            bVar6 = false;
          }
          else {
            bVar6 = false;
            MVar14 = FATAL_ERROR;
          }
          poVar12 = std::operator<<((ostream *)&obj_dir,
                                    "Found relative path while evaluating include directories of \""
                                   );
          psVar13 = GetName_abi_cxx11_(this);
          poVar12 = std::operator<<(poVar12,(string *)psVar13);
          poVar12 = std::operator<<(poVar12,"\":\n  \"");
          poVar12 = std::operator<<(poVar12,(string *)psVar10);
          std::operator<<(poVar12,"\"\n");
          if (!bVar6) goto LAB_003d9630;
        }
        else {
          poVar12 = std::operator<<((ostream *)&obj_dir,"Target \"");
          poVar12 = std::operator<<(poVar12,(string *)local_328);
          poVar12 = std::operator<<(poVar12,
                                    "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                   );
          poVar12 = std::operator<<(poVar12,(string *)psVar10);
          std::operator<<(poVar12,"\"");
          MVar14 = FATAL_ERROR;
LAB_003d9630:
          pcVar4 = this->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar4,MVar14,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          if (MVar14 == FATAL_ERROR) goto LAB_003d98d8;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
      }
      value._M_str = (psVar10->_M_dataplus)._M_p;
      value._M_len = psVar10->_M_string_length;
      bVar6 = cmValue::IsOff(value);
      if (!bVar6) {
        cmsys::SystemTools::ConvertToUnixSlashes(psVar10);
      }
      _Var16 = std::__detail::
               _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&uniqueIncludes,psVar10);
      if (((undefined1  [16])_Var16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string&,cmListFileBacktrace&>(local_378,psVar10,local_320);
        if ((char)local_36c != '\0') {
          std::operator+(&local_348," * ",psVar10);
          std::operator+(&obj_dir,&local_348,"\n");
          std::__cxx11::string::append((string *)&propertyName);
          std::__cxx11::string::~string((string *)&obj_dir);
          std::__cxx11::string::~string((string *)&local_348);
        }
      }
    }
    if (propertyName._M_string_length != 0) {
      this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"Used includes for target ",&local_379);
      psVar10 = GetName_abi_cxx11_(this);
      std::operator+(&local_d0,&local_128,psVar10);
      std::operator+(&local_348,&local_d0,":\n");
      std::operator+(&obj_dir,&local_348,&propertyName);
      cmake::IssueMessage(this_02,LOG,&obj_dir,local_320);
      std::__cxx11::string::~string((string *)&obj_dir);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::~string((string *)&propertyName);
    pEVar15 = pEVar15 + 1;
  } while( true );
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  if (this->Makefile->IsOn("APPLE")) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir = cmSystemTools::CollapseFullPath(
          lib.AsStr(), this->Makefile->GetHomeOutputDirectory());

        static cmsys::RegularExpression frameworkCheck(
          "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        if (!frameworkCheck.find(libDir)) {
          continue;
        }

        libDir = frameworkCheck.match(1);

        EvaluatedTargetPropertyEntry ee(lib, cmListFileBacktrace());
        ee.Values.emplace_back(std::move(libDir));
        entries.Entries.emplace_back(std::move(ee));
      }
    }
  }

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  return includes;
}